

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O0

char * choc::text::FloatToStringBuffer<double>::writeWithoutExponentLessThan1
                 (char *dest,uint32_t length,int mantissaDigits,int maxDecimalPlaces)

{
  int local_2c;
  int i;
  uint32_t numPaddingZeros;
  int maxDecimalPlaces_local;
  int mantissaDigits_local;
  uint32_t length_local;
  char *dest_local;
  
  insertChar(dest,length,'0',2U - mantissaDigits);
  dest[1] = '.';
  if (maxDecimalPlaces + mantissaDigits < (int)length) {
    for (local_2c = maxDecimalPlaces + 1; 2 < local_2c; local_2c = local_2c + -1) {
      if (dest[local_2c] != '0') {
        return dest + (local_2c + 1);
      }
    }
    dest_local = dest + 3;
  }
  else {
    for (maxDecimalPlaces_local = (2U - mantissaDigits) + length;
        dest[maxDecimalPlaces_local - 1] == '0' && 3 < (uint)maxDecimalPlaces_local;
        maxDecimalPlaces_local = maxDecimalPlaces_local + -1) {
    }
    dest_local = dest + (uint)maxDecimalPlaces_local;
  }
  return dest_local;
}

Assistant:

static char* writeWithoutExponentLessThan1 (char* dest, uint32_t length, int mantissaDigits, int maxDecimalPlaces)
    {
        auto numPaddingZeros = static_cast<uint32_t> (2 - mantissaDigits);
        insertChar (dest, length, '0', numPaddingZeros);
        dest[1] = '.';

        if (static_cast<int> (length) > maxDecimalPlaces + mantissaDigits)
        {
            for (int i = maxDecimalPlaces + 1; i > 2; --i)
                if (dest[i] != '0')
                    return dest + (i + 1);

            return dest + 3;
        }

        length += numPaddingZeros;

        while (dest[length - 1] == '0' && length > 3)
            --length;

        return dest + length;
    }